

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O1

IntrinsicResult MiniScript::intrinsic_sum(Context *context,IntrinsicResult partialResult)

{
  long *plVar1;
  long lVar2;
  ValueType VVar3;
  undefined8 uVar4;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *pDVar5;
  _func_int **pp_Var6;
  _func_int *p_Var7;
  char *pcVar8;
  ulong uVar9;
  HashMapEntry<MiniScript::Value,_MiniScript::Value> *pHVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  double dVar15;
  RefCountedStorage *pRVar16;
  Value val;
  ValueDict map;
  anon_union_8_3_2f476f46_for_data local_90;
  undefined1 local_80 [16];
  RefCountedStorage *local_70;
  _func_int **local_68;
  char local_60;
  Value local_58;
  ValueDict local_48;
  
  local_60 = '\0';
  pp_Var6 = (_func_int **)operator_new(0x30);
  pp_Var6[1] = (_func_int *)0x1;
  *pp_Var6 = (_func_int *)&PTR__StringStorage_001d10b0;
  pp_Var6[3] = (_func_int *)0x5;
  pp_Var6[4] = (_func_int *)0xffffffffffffffff;
  p_Var7 = (_func_int *)operator_new__(5);
  pp_Var6[2] = p_Var7;
  p_Var7[4] = (code)0x0;
  *(undefined4 *)p_Var7 = 0x666c6573;
  local_68 = pp_Var6;
  Context::GetVar((Context *)local_80,(String *)partialResult.rs,(LocalOnlyMode)&local_68);
  if ((local_68 != (_func_int **)0x0) && (local_60 == '\0')) {
    pp_Var6 = local_68 + 1;
    *pp_Var6 = *pp_Var6 + -1;
    if (*pp_Var6 == (_func_int *)0x0) {
      (**(code **)(*local_68 + 8))();
    }
    local_68 = (_func_int **)0x0;
  }
  uVar4 = local_80._8_8_;
  if (local_80[0] == Map) {
    Value::GetDict(&local_48,(Value *)local_80);
    pDVar5 = local_48.ds;
    uVar12 = 0;
    if (local_48.ds == (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
LAB_0015b776:
      uVar12 = 0;
      pHVar10 = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0;
    }
    else {
      pHVar10 = (local_48.ds)->mTable[0];
      if (pHVar10 == (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0) {
        uVar12 = 0;
        do {
          uVar9 = uVar12;
          if (uVar9 == 0xfa) goto LAB_0015b776;
          uVar12 = uVar9 + 1;
        } while ((local_48.ds)->mTable[uVar9 + 1] ==
                 (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0);
        pHVar10 = (local_48.ds)->mTable[uVar9 + 1];
        if (0xf9 < uVar9) {
          pHVar10 = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0;
        }
        uVar12 = uVar9 + 1 & 0xffffffff;
      }
    }
    if (pHVar10 == (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0) {
      local_90.number = 0.0;
    }
    else {
      local_90.number = 0.0;
      do {
        VVar3 = (pHVar10->value).type;
        local_70 = (pHVar10->value).data.ref;
        if ((Temp < VVar3) && (local_70 != (RefCountedStorage *)0x0)) {
          local_70->refCount = local_70->refCount + 1;
        }
        pRVar16 = local_70;
        if (VVar3 != Number) {
          pRVar16 = (RefCountedStorage *)0x0;
        }
        if ((Temp < VVar3) && (local_70 != (RefCountedStorage *)0x0)) {
          plVar1 = &local_70->refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*local_70->_vptr_RefCountedStorage[1])();
          }
          local_70 = (RefCountedStorage *)0x0;
        }
        pHVar10 = pHVar10->next;
        if (pHVar10 == (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0) {
          iVar11 = (int)uVar12;
          uVar9 = 0xfa;
          if (0xfa < iVar11) {
            uVar9 = uVar12;
          }
          if (iVar11 < 0xfa) {
            lVar13 = 0;
            do {
              pHVar10 = pDVar5->mTable[(long)iVar11 + lVar13 + 1];
              lVar2 = lVar13 + 1;
              if (pHVar10 != (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0) break;
              bVar14 = ~(long)iVar11 + uVar9 != lVar13;
              lVar13 = lVar2;
            } while (bVar14);
            uVar12 = (ulong)(uint)(iVar11 + (int)lVar2);
          }
        }
        local_90.ref = (RefCountedStorage *)(local_90.number + pRVar16);
      } while (pHVar10 != (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0);
    }
    local_48._vptr_Dictionary = (_func_int **)&PTR__Dictionary_001d1238;
    if ((local_48.ds != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
       (local_48.isTemp == false)) {
      plVar1 = &((local_48.ds)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_48.ds)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_48.ds = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
    }
  }
  else {
    local_90.number = 0.0;
    if (local_80[0] == List) {
      if ((RefCountedStorage *)local_80._8_8_ == (RefCountedStorage *)0x0) {
        pp_Var6 = (_func_int **)0x0;
      }
      else {
        *(long *)(local_80._8_8_ + 8) = *(long *)(local_80._8_8_ + 8) + 1;
        pp_Var6 = ((RefCountedStorage *)(local_80._8_8_ + 0x20))->_vptr_RefCountedStorage;
      }
      if ((long)pp_Var6 < 1) {
        local_90.number = 0.0;
      }
      else {
        lVar13 = (long)pp_Var6 << 4;
        local_90.number = 0.0;
        do {
          lVar13 = lVar13 + -0x10;
          if ((RefCountedStorage *)uVar4 == (RefCountedStorage *)0x0) {
            _Error("Assert failed: ls",
                   "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
                   ,0x3b);
          }
          if ((long)((RefCountedStorage *)(uVar4 + 0x20))->_vptr_RefCountedStorage < (long)pp_Var6)
          {
            _Error("invalid index in SimpleVector::operator[]",
                   "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                   ,0xc1);
            pcVar8 = (char *)((RefCountedStorage *)(uVar4 + 0x10))->refCount;
          }
          else {
            pcVar8 = (char *)(((RefCountedStorage *)(uVar4 + 0x10))->refCount + lVar13);
          }
          if (*pcVar8 == '\x01') {
            dVar15 = *(double *)(pcVar8 + 8);
          }
          else {
            dVar15 = 0.0;
          }
          local_90.number = local_90.number + dVar15;
          bVar14 = 1 < (long)pp_Var6;
          pp_Var6 = (_func_int **)((long)pp_Var6 + -1);
        } while (bVar14);
      }
      if ((RefCountedStorage *)uVar4 != (RefCountedStorage *)0x0) {
        plVar1 = (long *)(uVar4 + 8);
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*(*(_func_int ***)uVar4)[1])(uVar4);
        }
      }
    }
  }
  local_58.type = Number;
  local_58.noInvoke = false;
  local_58.localOnly = Off;
  (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
  local_58.data = local_90;
  IntrinsicResult::ensureStorage((IntrinsicResult *)context);
  Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                   &local_58);
  *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
  if ((2 < local_58.type) && (local_58.data.ref != (RefCountedStorage *)0x0)) {
    plVar1 = &(local_58.data.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_58.data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_58.data.number = 0.0;
  }
  if ((Temp < local_80[0]) && ((RefCountedStorage *)local_80._8_8_ != (RefCountedStorage *)0x0)) {
    plVar1 = (long *)(local_80._8_8_ + 8);
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(*(_func_int ***)local_80._8_8_)[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_sum(Context *context, IntrinsicResult partialResult) {
		Value val = context->GetVar("self");
		double sum = 0;
		if (val.type == ValueType::List) {
			ValueList list = val.GetList();
			for (long i=list.Count()-1; i>=0; i--) {
				sum += list[i].DoubleValue();
			}
		} else if (val.type == ValueType::Map) {
			ValueDict map = val.GetDict();
			for (ValueDictIterator kv = map.GetIterator(); !kv.Done(); kv.Next()) {
				sum += kv.Value().DoubleValue();
			}
		}
		return IntrinsicResult(sum);
	}